

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLog::WriteCreateMacro(WriteAheadLog *this,ScalarMacroCatalogEntry *entry)

{
  ScalarMacroCatalogEntry *local_5c0;
  WriteAheadLogSerializer serializer;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&serializer,this,CREATE_MACRO);
  local_5c0 = entry;
  Serializer::WriteProperty<duckdb::ScalarMacroCatalogEntry_const*>
            (&serializer.serializer.super_Serializer,0x65,"macro",&local_5c0);
  WriteAheadLogSerializer::End(&serializer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&serializer);
  return;
}

Assistant:

void WriteAheadLog::WriteCreateMacro(const ScalarMacroCatalogEntry &entry) {
	WriteAheadLogSerializer serializer(*this, WALType::CREATE_MACRO);
	serializer.WriteProperty(101, "macro", &entry);
	serializer.End();
}